

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O3

void __thiscall
CCollision::MovePoint
          (CCollision *this,vec2 *pInoutPos,vec2 *pInoutVel,float Elasticity,int *pBounces)

{
  vec2 vVar1;
  vec2 vVar2;
  bool bVar3;
  bool bVar4;
  anon_union_4_2_94730284_for_vector2_base<float>_1 x;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 y;
  anon_union_4_2_94730284_for_vector2_base<float>_1 x_00;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 y_00;
  
  if (pBounces != (int *)0x0) {
    *pBounces = 0;
  }
  x_00 = (*pInoutPos).field_0;
  y_00 = (*pInoutPos).field_1;
  x.x = (*pInoutVel).field_0.x + x_00.x;
  y.y = (*pInoutVel).field_1.y + y_00.y;
  vVar1.field_1.y = y.y;
  vVar1.field_0.x = x.x;
  bVar3 = CheckPoint(this,x.x,y.y,1);
  if (!bVar3) {
    *pInoutPos = vVar1;
    return;
  }
  bVar3 = CheckPoint(this,x.x,y_00.y,1);
  if (bVar3) {
    (pInoutVel->field_0).x = -Elasticity * (pInoutVel->field_0).x;
    if (pBounces != (int *)0x0) {
      *pBounces = *pBounces + 1;
    }
    bVar4 = CheckPoint(this,x_00.x,y.y,1);
    if (bVar4) {
LAB_001445d7:
      (pInoutVel->field_1).y = -Elasticity * (pInoutVel->field_1).y;
      if (pBounces == (int *)0x0) {
        return;
      }
      *pBounces = *pBounces + 1;
      return;
    }
    if (bVar3) {
      return;
    }
  }
  else {
    bVar3 = CheckPoint(this,x_00.x,y.y,1);
    if (bVar3) goto LAB_001445d7;
  }
  vVar2.field_1.y = -Elasticity * (*pInoutVel).field_1.y;
  vVar2.field_0.x = -Elasticity * (*pInoutVel).field_0.x;
  *pInoutVel = vVar2;
  return;
}

Assistant:

void CCollision::MovePoint(vec2 *pInoutPos, vec2 *pInoutVel, float Elasticity, int *pBounces) const
{
	if(pBounces)
		*pBounces = 0;

	vec2 Pos = *pInoutPos;
	vec2 Vel = *pInoutVel;
	if(CheckPoint(Pos + Vel))
	{
		int Affected = 0;
		if(CheckPoint(Pos.x + Vel.x, Pos.y))
		{
			pInoutVel->x *= -Elasticity;
			if(pBounces)
				(*pBounces)++;
			Affected++;
		}

		if(CheckPoint(Pos.x, Pos.y + Vel.y))
		{
			pInoutVel->y *= -Elasticity;
			if(pBounces)
				(*pBounces)++;
			Affected++;
		}

		if(Affected == 0)
		{
			pInoutVel->x *= -Elasticity;
			pInoutVel->y *= -Elasticity;
		}
	}
	else
	{
		*pInoutPos = Pos + Vel;
	}
}